

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O0

void check_FX(FX *fx68k)

{
  ushort uVar1;
  DLword DVar2;
  LispPTR LVar3;
  LispPTR *pLVar4;
  DLword local_34;
  uint local_30;
  int mblink;
  Bframe *mtmp;
  Bframe *dummybf;
  FX *fx68k_local;
  
  if (*(ushort *)&fx68k->field_0x2 >> 0xd != 6) {
    error("CheckFX:NOT FX");
  }
  uVar1 = fx68k->nextblock;
  DVar2 = StackOffsetFromNative(fx68k);
  if (uVar1 < DVar2) {
    error("FX\'s nextblock field < the FFX.");
  }
  DVar2 = StackOffsetFromNative(&fx68k[-1].clink);
  if (((undefined1  [20])*fx68k & (undefined1  [20])0x1) == (undefined1  [20])0x0) {
    LVar3 = LAddrFromNative(&fx68k[-1].clink);
    local_30 = LVar3 & 0xffff;
  }
  else {
    local_30 = (uint)fx68k->blink;
  }
  if (DVar2 != local_30) {
    if (((undefined1  [20])*fx68k & (undefined1  [20])0x1) == (undefined1  [20])0x0) {
      LVar3 = LAddrFromNative(&fx68k[-1].clink);
      local_34 = (DLword)LVar3;
    }
    else {
      local_34 = fx68k->blink;
    }
    pLVar4 = NativeAligned4FromStackOffset(local_34);
    if (((fx68k[-1].blink >> 9 & 1) == 0) || (fx68k[-1].clink != (DLword)*pLVar4)) {
      error("CheckFX:bad residual case");
    }
  }
  return;
}

Assistant:

void check_FX(FX *fx68k) {
  Bframe *dummybf, *mtmp;
  int mblink;

  /* The FX better really be an FX */

  if (((FX *)(fx68k))->flags != STK_FX) error("CheckFX:NOT FX");

  /* Make sure the NEXTBLOCK field of the FX */
  /* Points BEYOND the start of the FX; some */
  /* stack blocks have been corrupted this   */
  /* way.  --JDS 2/3/98                      */

  if (fx68k->nextblock < StackOffsetFromNative(fx68k) /*+FRAMESIZE*/) {
    error("FX's nextblock field < the FFX.");
  }

  /* Now make sure the FX is connected to */
  /* a Basic Frame.                       */

  dummybf = (Bframe *)DUMMYBF(fx68k);

  /* Check for connection via BLINK field: */
  if (StackOffsetFromNative(dummybf) == GETBLINK(fx68k)) return;

  mblink = GETBLINK(fx68k);
  mtmp = (Bframe *)NativeAligned4FromStackOffset(mblink);
  if ((dummybf->residual != NIL) && (dummybf->ivar == mtmp->ivar))
    return;
  else
    error("CheckFX:bad residual case");

}